

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O3

bool amrex::VisMF::Check(string *mf_name)

{
  ostringstream *poVar1;
  ostringstream *poVar2;
  pointer pcVar3;
  char cVar4;
  char cVar5;
  int iVar6;
  pointer pFVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  long lVar11;
  char c;
  string FullName;
  string FullHdrFileName;
  ifstream ifs;
  Header hdr;
  char local_561;
  string *local_560;
  int local_554;
  string local_550;
  long local_530;
  long *local_528;
  long local_520;
  long local_518 [2];
  Print local_508;
  undefined1 local_300 [24];
  undefined8 auStack_2e8 [46];
  Header local_178;
  Box local_4c;
  
  if (*(int *)(ParallelContext::frames + 0xc) != 0) {
    return true;
  }
  local_560 = mf_name;
  if (verbose != 0) {
    local_508.os = OutStream();
    local_508.rank = *(int *)(DAT_0071a620 + -0x30);
    poVar1 = &local_508.ss;
    local_508.comm = *(MPI_Comm *)(DAT_0071a620 + -0x48);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    *(undefined8 *)(&local_508.field_0x18 + *(long *)(local_508._16_8_ + -0x18)) =
         *(undefined8 *)(local_508.os + *(long *)(*(long *)local_508.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"---------------- VisMF::Check:  about to check:  ",0x31);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,(local_560->_M_dataplus)._M_p,local_560->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(local_508._16_8_ + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    Print::~Print(&local_508);
  }
  Header::Header(&local_178);
  local_528 = local_518;
  pcVar3 = (local_560->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_528,pcVar3,pcVar3 + local_560->_M_string_length);
  std::__cxx11::string::append((char *)&local_528);
  std::ifstream::ifstream(&local_508,(char *)local_528,_S_in);
  amrex::operator>>((istream *)&local_508,&local_178);
  std::ifstream::close();
  std::ifstream::~ifstream(&local_508);
  if (verbose != 0) {
    local_508.os = OutStream();
    local_508.rank = *(int *)(DAT_0071a620 + -0x30);
    poVar1 = &local_508.ss;
    local_508.comm = *(MPI_Comm *)(DAT_0071a620 + -0x48);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    *(undefined8 *)(&local_508.field_0x18 + *(long *)(local_508._16_8_ + -0x18)) =
         *(undefined8 *)(local_508.os + *(long *)(*(long *)local_508.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"hdr.version =  ",0xf);
    std::ostream::operator<<(poVar1,local_178.m_vers);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"hdr.boxarray size =  ",0x15);
    std::ostream::_M_insert<long>((long)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"mf.ncomp =  ",0xc);
    std::ostream::operator<<(poVar1,local_178.m_ncomp);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"number of fabs on disk =  ",0x1a);
    std::ostream::_M_insert<long>((long)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"DirName = ",10);
    DirName((string *)local_300,local_560);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,(char *)CONCAT44(local_300._4_4_,local_300._0_4_),local_300._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"mf_name = ",10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,(local_560->_M_dataplus)._M_p,local_560->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"FullHdrFileName = ",0x12);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,(char *)local_528,local_520);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
    if ((undefined1 *)CONCAT44(local_300._4_4_,local_300._0_4_) != local_300 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_300._4_4_,local_300._0_4_),local_300._16_8_ + 1);
    }
    Print::~Print(&local_508);
  }
  if (local_178.m_vers == 1) {
    if (local_178.m_fod.
        super_vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>.
        super__Vector_base<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        local_178.m_fod.
        super_vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>.
        super__Vector_base<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>.
        _M_impl.super__Vector_impl_data._M_start &&
        -1 < (long)local_178.m_fod.
                   super_vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>.
                   super__Vector_base<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_178.m_fod.
                   super_vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>.
                   super__Vector_base<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>
                   ._M_impl.super__Vector_impl_data._M_start) {
      local_530 = 0;
      lVar9 = 0x20;
      lVar11 = 0;
      local_554 = 0;
      do {
        pFVar7 = local_178.m_fod.
                 super_vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>.
                 super__Vector_base<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        DirName(&local_550,local_560);
        std::__cxx11::string::_M_append((char *)&local_550,*(ulong *)((long)pFVar7 + lVar9 + -0x20))
        ;
        std::ifstream::ifstream(&local_508);
        std::ifstream::open((char *)&local_508,(_Ios_Openmode)local_550._M_dataplus._M_p);
        if (*(int *)(&local_508.field_0x20 +
                    *(long *)(CONCAT44(local_508.comm,local_508.rank) + -0x18)) == 0) {
          std::istream::seekg((long)&local_508,
                              (_Ios_Seekdir)
                              *(undefined8 *)((long)&(pFVar7->m_name)._M_dataplus._M_p + lVar9));
          std::operator>>((istream *)&local_508,&local_561);
          cVar4 = local_561;
          std::operator>>((istream *)&local_508,&local_561);
          cVar5 = local_561;
          std::operator>>((istream *)&local_508,&local_561);
          if ((((local_561 != 'B') || (cVar5 != 'A')) || (cVar4 != 'F')) &&
             (local_554 = local_554 + 1, verbose != 0)) {
            local_300._8_8_ = OutStream();
            poVar2 = (ostringstream *)(local_300 + 0x10);
            local_300._0_4_ = -1;
            local_300._4_4_ = *(MPI_Comm *)(DAT_0071a620 + -0x48);
            std::__cxx11::ostringstream::ostringstream(poVar2);
            *(undefined8 *)((long)auStack_2e8 + *(long *)(local_300._16_8_ - 0x18)) =
                 *(undefined8 *)(local_300._8_8_ + *(long *)(*(long *)local_300._8_8_ + -0x18) + 8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar2,"**** Error in file:  ",0x15);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar2,local_550._M_dataplus._M_p,local_550._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar2,"  Bad Fab at index = ",0x15);
            std::ostream::operator<<(poVar2,(int)lVar11);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"  seekpos = ",0xc)
            ;
            std::ostream::_M_insert<long>((long)poVar2);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"  box = ",8);
            BATransformer::operator()
                      (&local_4c,&local_178.m_ba.m_bat,
                       (Box *)((long)&(((local_178.m_ba.m_ref.
                                         super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->m_abox).
                                       super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                       _M_impl.super__Vector_impl_data._M_start)->smallend +
                              local_530));
            amrex::operator<<((ostream *)poVar2,&local_4c);
            std::ios::widen((char)*(undefined8 *)(local_300._16_8_ - 0x18) + (char)poVar2);
            std::ostream::put((char)poVar2);
            std::ostream::flush();
            Print::~Print((Print *)local_300);
          }
          std::ifstream::close();
        }
        else if (verbose != 0) {
          local_300._8_8_ = OutStream();
          poVar2 = (ostringstream *)(local_300 + 0x10);
          local_300._0_4_ = -1;
          local_300._4_4_ = *(MPI_Comm *)(DAT_0071a620 + -0x48);
          std::__cxx11::ostringstream::ostringstream(poVar2);
          *(undefined8 *)((long)auStack_2e8 + *(long *)(local_300._16_8_ - 0x18)) =
               *(undefined8 *)(local_300._8_8_ + *(long *)(*(long *)local_300._8_8_ + -0x18) + 8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2,"**** Error:  could not open file:  ",0x23);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2,local_550._M_dataplus._M_p,local_550._M_string_length);
          std::ios::widen((char)*(undefined8 *)(local_300._16_8_ - 0x18) + (char)poVar2);
          std::ostream::put((char)poVar2);
          std::ostream::flush();
          Print::~Print((Print *)local_300);
        }
        std::ifstream::~ifstream(&local_508);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_550._M_dataplus._M_p != &local_550.field_2) {
          operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
        }
        iVar6 = local_554;
        lVar11 = lVar11 + 1;
        lVar8 = ((long)local_178.m_fod.
                       super_vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>
                       .
                       super__Vector_base<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_178.m_fod.
                       super_vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>
                       .
                       super__Vector_base<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
        lVar9 = lVar9 + 0x28;
        local_530 = local_530 + 0x1c;
      } while (lVar8 - lVar11 != 0 && lVar11 <= lVar8);
      if (local_554 != 0) {
        if (verbose != 0) {
          local_508.os = OutStream();
          poVar1 = &local_508.ss;
          local_508.rank = -1;
          local_508.comm = *(MPI_Comm *)(DAT_0071a620 + -0x48);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
          *(undefined8 *)(&local_508.field_0x18 + *(long *)(local_508._16_8_ + -0x18)) =
               *(undefined8 *)(local_508.os + *(long *)(*(long *)local_508.os + -0x18) + 8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"Total Bad Fabs = ",0x11);
          std::ostream::operator<<(poVar1,iVar6);
          std::ios::widen((char)*(undefined8 *)(local_508._16_8_ + -0x18) + (char)poVar1);
          std::ostream::put((char)poVar1);
          std::ostream::flush();
          Print::~Print(&local_508);
        }
        bVar10 = false;
        goto LAB_00443822;
      }
    }
    bVar10 = true;
    if (verbose == 0) goto LAB_00443822;
    local_508.os = OutStream();
    poVar1 = &local_508.ss;
    local_508.rank = -1;
    local_508.comm = *(MPI_Comm *)(DAT_0071a620 + -0x48);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    *(undefined8 *)(&local_508.field_0x18 + *(long *)(local_508._16_8_ + -0x18)) =
         *(undefined8 *)(local_508.os + *(long *)(*(long *)local_508.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"No Bad Fabs.",0xc);
    std::ios::widen((char)*(undefined8 *)(local_508._16_8_ + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  else {
    bVar10 = true;
    if (verbose == 0) goto LAB_00443822;
    local_508.os = OutStream();
    local_508.rank = *(int *)(DAT_0071a620 + -0x30);
    poVar1 = &local_508.ss;
    local_508.comm = *(MPI_Comm *)(DAT_0071a620 + -0x48);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    *(undefined8 *)(&local_508.field_0x18 + *(long *)(local_508._16_8_ + -0x18)) =
         *(undefined8 *)(local_508.os + *(long *)(*(long *)local_508.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"**** VisMF::Check currently only supports Version_v1.",0x35);
    std::ios::widen((char)*(undefined8 *)(local_508._16_8_ + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  bVar10 = true;
  Print::~Print(&local_508);
LAB_00443822:
  if (local_528 != local_518) {
    operator_delete(local_528,local_518[0] + 1);
  }
  Header::~Header(&local_178);
  return bVar10;
}

Assistant:

bool
VisMF::Check (const std::string& mf_name)
{
//  BL_PROFILE("VisMF::Check()");

  int isOk(true);  // ---- int to broadcast
  int v1(true);

  if(ParallelDescriptor::IOProcessor()) {
   if (verbose) {
       amrex::Print() << "---------------- VisMF::Check:  about to check:  " << mf_name << std::endl;
   }

    char c;
    int nBadFabs(0);
    VisMF::Header hdr;
    std::string FullHdrFileName(mf_name);
    FullHdrFileName += TheMultiFabHdrFileSuffix;

    {
        std::ifstream ifs(FullHdrFileName.c_str());
        ifs >> hdr;
        ifs.close();
    }

    if (verbose) {
        amrex::Print() << "hdr.version =  " << hdr.m_vers << "\n"
                       << "hdr.boxarray size =  " << hdr.m_ba.size() << "\n"
                       << "mf.ncomp =  " << hdr.m_ncomp << "\n"
                       << "number of fabs on disk =  " << hdr.m_fod.size() << "\n"
                       << "DirName = " << DirName(mf_name) << "\n"
                       << "mf_name = " << mf_name << "\n"
                       << "FullHdrFileName = " << FullHdrFileName << "\n";
    }

    if(hdr.m_vers != VisMF::Header::Version_v1) {
     v1 = false;
     if (verbose) {
         amrex::Print() << "**** VisMF::Check currently only supports Version_v1." << std::endl;
     }
    } else {

    // check that the string FAB is where it should be
    for(int i(0); i < hdr.m_fod.size(); ++i) {
      bool badFab(false);
      FabOnDisk &fod = hdr.m_fod[i];
      std::string FullName(VisMF::DirName(mf_name));
      FullName += fod.m_name;
      std::ifstream ifs;
      ifs.open(FullName.c_str(), std::ios::in|std::ios::binary);

      if( ! ifs.good()) {
          if (verbose) {
              amrex::AllPrint() << "**** Error:  could not open file:  " << FullName << std::endl;
          }
          continue;
      }

      ifs.seekg(fod.m_head, std::ios::beg);

      ifs >> c;
      if(c != 'F') {
        badFab = true;
      }
      ifs >> c;
      if(c != 'A') {
        badFab = true;
      }
      ifs >> c;
      if(c != 'B') {
        badFab = true;
      }
      if(badFab) {
        ++nBadFabs;
        if (verbose) {
            amrex::AllPrint() << "**** Error in file:  " << FullName << "  Bad Fab at index = "
                              << i << "  seekpos = " << fod.m_head << "  box = " << hdr.m_ba[i]
                              << std::endl;
        }
      }
      ifs.close();

    }
    if(nBadFabs) {
        if (verbose) {
            amrex::AllPrint() << "Total Bad Fabs = " << nBadFabs << std::endl;
        }
        isOk = false;
    } else {
        if (verbose) {
            amrex::AllPrint() << "No Bad Fabs." << std::endl;
        }
        isOk = true;
    }
    }

  }
  ParallelDescriptor::Bcast(&isOk, 1, ParallelDescriptor::IOProcessorNumber());
  ParallelDescriptor::Bcast(&v1,  1, ParallelDescriptor::IOProcessorNumber());

  return isOk;

}